

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O3

ON_Internal_ExtrudedVertex * __thiscall
ON_SimpleArray<ON_Internal_ExtrudedVertex>::AppendNew
          (ON_SimpleArray<ON_Internal_ExtrudedVertex> *this)

{
  int iVar1;
  ON_Internal_ExtrudedVertex *pOVar2;
  ON_Internal_ExtrudedVertex *pOVar3;
  uint uVar4;
  uint uVar5;
  
  uVar4 = this->m_count;
  if (uVar4 == this->m_capacity) {
    if (((int)uVar4 < 8) || ((ulong)((long)(int)uVar4 * 0x38) < 0x10000001)) {
      uVar5 = 4;
      if (2 < (int)uVar4) {
        uVar5 = uVar4 * 2;
      }
    }
    else {
      uVar5 = 0x49249a;
      if (uVar4 < 0x49249a) {
        uVar5 = uVar4;
      }
      uVar5 = uVar5 + uVar4;
    }
    if (uVar4 < uVar5) {
      SetCapacity(this,(long)(int)uVar5);
      uVar4 = this->m_count;
    }
  }
  pOVar2 = this->m_a;
  pOVar2[(int)uVar4].m_original_vertex = (ON_SubDVertex *)0x0;
  (&pOVar2[(int)uVar4].m_original_vertex)[1] = (ON_SubDVertex *)0x0;
  pOVar3 = pOVar2 + (int)uVar4;
  pOVar3->m_extruded_edges_count = '\0';
  pOVar3->m_initial_vertex_tag = Unset;
  pOVar3->m_connecting_edge_tag = Unset;
  pOVar3->field_0x13 = 0;
  pOVar3->m_initial_vertex_id = 0;
  *(undefined8 *)(&pOVar3->m_extruded_edges_count + 8) = 0;
  pOVar2[(int)uVar4].m_extruded_edges[0] = (ON_Internal_ExtrudedEdge *)0x0;
  pOVar2[(int)uVar4].m_extruded_edges[1] = (ON_Internal_ExtrudedEdge *)0x0;
  pOVar2[(int)uVar4].m_connecting_edge = (ON_SubDEdge *)0x0;
  iVar1 = this->m_count;
  this->m_count = iVar1 + 1;
  return this->m_a + iVar1;
}

Assistant:

T& ON_SimpleArray<T>::AppendNew()
{
  if ( m_count == m_capacity ) 
  {
    int new_capacity = NewCapacity();
    Reserve( new_capacity );
  }
  memset( (void*)(&m_a[m_count]), 0, sizeof(T) );
  return m_a[m_count++];
}